

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdICHull.cpp
# Opt level: O2

CircularListElement<HACD::TMMTriangle> * __thiscall
HACD::ICHUll::MakeConeFace
          (ICHUll *this,CircularListElement<HACD::TMMEdge> *e,
          CircularListElement<HACD::TMMVertex> *p)

{
  CircularListElement<HACD::TMMEdge> *pCVar1;
  int i;
  CircularListElement<HACD::TMMVertex> *pCVar2;
  CircularListElement<HACD::TMMTriangle> *f;
  long lVar3;
  ICHUll *this_00;
  long lVar4;
  long alStack_50 [3];
  CircularListElement<HACD::TMMEdge> *newEdges [2];
  
  this_00 = (ICHUll *)&this->m_mesh;
  for (lVar4 = 3; lVar4 != 5; lVar4 = lVar4 + 1) {
    pCVar2 = ((e->m_data).m_triangles[lVar4 + -1]->m_data).m_vertices[1];
    alStack_50[lVar4] = (long)pCVar2;
    if (pCVar2 == (CircularListElement<HACD::TMMVertex> *)0x0) {
      alStack_50[2] = 0xd9165a;
      pCVar2 = (CircularListElement<HACD::TMMVertex> *)TMMesh::AddEdge((TMMesh *)this_00);
      alStack_50[lVar4] = (long)pCVar2;
      (pCVar2->m_data).m_name = (long)(e->m_data).m_triangles[lVar4 + -1];
      (pCVar2->m_data).m_id = (size_t)p;
      ((e->m_data).m_triangles[lVar4 + -1]->m_data).m_vertices[1] = pCVar2;
    }
  }
  alStack_50[2] = 0xd91680;
  f = TMMesh::AddTriangle((TMMesh *)this_00);
  (f->m_data).m_edges[0] = e;
  (f->m_data).m_edges[1] = newEdges[0];
  (f->m_data).m_edges[2] = newEdges[1];
  alStack_50[2] = 0xd9169f;
  MakeCCW(this_00,f,e,p);
  lVar4 = 0;
  do {
    if (lVar4 == 2) {
      return f;
    }
    pCVar1 = newEdges[lVar4];
    if ((pCVar1->m_data).m_triangles[0] == (CircularListElement<HACD::TMMTriangle> *)0x0) {
      lVar3 = 0;
LAB_00d916c3:
      (pCVar1->m_data).m_triangles[lVar3] = f;
    }
    else {
      lVar3 = 1;
      if ((pCVar1->m_data).m_triangles[1] == (CircularListElement<HACD::TMMTriangle> *)0x0)
      goto LAB_00d916c3;
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

CircularListElement<TMMTriangle> * ICHUll::MakeConeFace(CircularListElement<TMMEdge> * e, CircularListElement<TMMVertex> * p)
	{
        // create two new edges if they don't already exist
        CircularListElement<TMMEdge> * newEdges[2];
        for(int i = 0; i < 2; ++i)
        {
            if ( !( newEdges[i] = e->GetData().m_vertices[i]->GetData().m_duplicate ) )  
            { // if the edge doesn't exits add it and mark the vertex as duplicated
                newEdges[i] = m_mesh.AddEdge();
                newEdges[i]->GetData().m_vertices[0] = e->GetData().m_vertices[i];
                newEdges[i]->GetData().m_vertices[1] = p;
                e->GetData().m_vertices[i]->GetData().m_duplicate = newEdges[i];
            }
        }
        // make the new face
        CircularListElement<TMMTriangle> * newFace = m_mesh.AddTriangle();
        newFace->GetData().m_edges[0] = e;
        newFace->GetData().m_edges[1] = newEdges[0];
        newFace->GetData().m_edges[2] = newEdges[1];
        MakeCCW(newFace, e, p);
        for(int i=0; i < 2; ++i)
        {
            for(int j=0; j < 2; ++j)
            {
                if ( ! newEdges[i]->GetData().m_triangles[j] )
                {
                    newEdges[i]->GetData().m_triangles[j] = newFace;
                    break;
                }
            }
        }
		return newFace;
	}